

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O3

void CallSignalWithSingleConnection_SignalShouldBeCalled(void)

{
  bool receiverCalled;
  signal<void_(int,_bool)> sg;
  bool local_51;
  signal<void_(int,_bool)> local_50;
  bool *local_40;
  char local_38 [8];
  code *local_30;
  code *local_28;
  connection local_20;
  
  TestRunner::StartTest("CallSignalWithSingleConnection_SignalShouldBeCalled");
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_50._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_50._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_50._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a9b0
  ;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_50._data.
            super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_50._data.
    super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._M_use_count =
       local_50._data.
       super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 4;
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_50._data.
        super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 4);
  local_50._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_40 = &local_51;
  local_51 = false;
  local_38[0] = '\a';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\x01';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_28 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:61:44)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:61:44)>
             ::_M_manager;
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_20,(int)&local_50,(sockaddr *)&local_40,0);
  lsignal::connection::~connection(&local_20);
  lsignal::signal<void_(int,_bool)>::operator()(&local_50,7,true);
  AssertHelper::VerifyValue(local_51,true,"Receiver should be called.");
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  if (local_50._data.
      super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50._data.
               super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void CallSignalWithSingleConnection_SignalShouldBeCalled()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(p0, paramOne, "First parameter should be as expected.");
		AssertHelper::VerifyValue(p1, paramTwo, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	sg(paramOne, paramTwo);

	AssertHelper::VerifyValue(receiverCalled, true, "Receiver should be called.");
}